

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O0

Error * __thiscall
Worker::parse_and_validate_json_request(Error *__return_storage_ptr__,Worker *this,string *request)

{
  bool bVar1;
  ParseErrorCode parseErrorCode;
  Ch *str;
  char *pcVar2;
  size_t sVar3;
  pointer pSVar4;
  Task *this_00;
  Task *local_108;
  Task *task;
  ValueType *json_task;
  ValueIterator __end1;
  ValueIterator __begin1;
  undefined8 local_e0;
  Array *__range1;
  undefined4 local_b4;
  string local_b0;
  undefined1 local_80 [8];
  Document document;
  string *request_local;
  Worker *this_local;
  
  document.parseResult_.offset_ = (size_t)request;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)local_80,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  str = (Ch *)std::__cxx11::string::c_str();
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Parse((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           *)local_80,str);
  bVar1 = rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::HasParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                           *)local_80);
  if (bVar1) {
    parseErrorCode =
         rapidjson::
         GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         ::GetParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)local_80);
    pcVar2 = rapidjson::GetParseError_En(parseErrorCode);
    sVar3 = rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::GetErrorOffset((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                              *)local_80);
    format_abi_cxx11_(&local_b0,"Request JSON incorrect: %s (at %zi)",pcVar2,sVar3);
    Error::Error(__return_storage_ptr__,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    pSVar4 = std::unique_ptr<SchemaValidator,_std::default_delete<SchemaValidator>_>::operator->
                       (&this->request_validator_);
    bVar1 = SchemaValidator::validate(pSVar4,(Document *)local_80);
    if (bVar1) {
      bVar1 = std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>::empty(&this->tasks_);
      if (!bVar1) {
        __assert_fail("tasks_.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/src/worker.cpp"
                      ,0xa8,"Error Worker::parse_and_validate_json_request(const std::string &)");
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      operator[]<char_const>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)local_80,"tasks");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&__begin1);
      local_e0 = &__begin1;
      __end1 = rapidjson::
               GenericArray<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
               ::begin((GenericArray<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                        *)local_e0);
      json_task = rapidjson::
                  GenericArray<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                  ::end((GenericArray<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                         *)local_e0);
      for (; __end1 != json_task; __end1 = __end1 + 1) {
        task = (Task *)__end1;
        this_00 = (Task *)operator_new(0x118);
        memset(this_00,0,0x118);
        libsbox::Task::Task(this_00);
        local_108 = this_00;
        libsbox::Task::
        deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                  (this_00,(Value *)task);
        std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>::push_back
                  (&this->tasks_,&local_108);
      }
      local_b4 = 2;
      rapidjson::
      GenericArray<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
      ::~GenericArray((GenericArray<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                       *)&__begin1);
      memset(__return_storage_ptr__,0,0x20);
      Error::Error(__return_storage_ptr__);
    }
    else {
      pSVar4 = std::unique_ptr<SchemaValidator,_std::default_delete<SchemaValidator>_>::operator->
                         (&this->request_validator_);
      SchemaValidator::get_error_abi_cxx11_((string *)&__range1,pSVar4);
      Error::Error(__return_storage_ptr__,(string *)&__range1);
      std::__cxx11::string::~string((string *)&__range1);
    }
  }
  local_b4 = 1;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)local_80);
  return __return_storage_ptr__;
}

Assistant:

Error Worker::parse_and_validate_json_request(const std::string &request) {
    rapidjson::Document document;
    document.Parse(request.c_str());

    if (document.HasParseError()) {
        return Error(format(
            "Request JSON incorrect: %s (at %zi)",
            GetParseError_En(document.GetParseError()),
            document.GetErrorOffset()
        ));
    }

    if (!request_validator_->validate(document)) {
        return Error(request_validator_->get_error());
    }

    assert(tasks_.empty());

    for (const auto &json_task : document["tasks"].GetArray()) {
        libsbox::Task *task = new libsbox::Task();
        task->deserialize_request(json_task);
        tasks_.push_back(task);
    }

    return Error();
}